

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__process_frame_header(stbi__jpeg *z,int scan)

{
  stbi_uc *psVar1;
  int b;
  undefined8 *puVar2;
  stbi__uint32 b_00;
  stbi__context *s;
  byte bVar3;
  uint uVar4;
  int iVar5;
  stbi__uint32 sVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  stbi_uc *psVar10;
  byte *pbVar11;
  void *pvVar12;
  int extraout_EDX;
  int extraout_EDX_00;
  int why;
  int iVar13;
  long lVar14;
  int a;
  ulong uVar15;
  int iVar16;
  int *piVar17;
  ulong uVar18;
  
  s = z->s;
  uVar4 = stbi__get16be(s);
  if (uVar4 < 0xb) {
LAB_003163d3:
    stbi__g_failure_reason = "bad SOF len";
  }
  else {
    psVar10 = s->img_buffer;
    if (psVar10 < s->img_buffer_end) {
LAB_0031644f:
      s->img_buffer = psVar10 + 1;
      if (*psVar10 == '\b') {
        sVar6 = stbi__get16be(s);
        s->img_y = sVar6;
        if (sVar6 == 0) {
          stbi__g_failure_reason = "no header height";
          return 0;
        }
        sVar6 = stbi__get16be(s);
        s->img_x = sVar6;
        if (sVar6 == 0) {
          stbi__g_failure_reason = "0 width";
          return 0;
        }
        pbVar11 = s->img_buffer;
        if (pbVar11 < s->img_buffer_end) {
LAB_00316513:
          s->img_buffer = pbVar11 + 1;
          bVar3 = *pbVar11;
        }
        else {
          if (s->read_from_callbacks != 0) {
            psVar10 = s->buffer_start;
            iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar10,s->buflen);
            if (iVar5 == 0) {
              s->read_from_callbacks = 0;
              s->img_buffer = psVar10;
              s->img_buffer_end = s->buffer_start + 1;
              s->buffer_start[0] = '\0';
            }
            else {
              s->img_buffer = psVar10;
              s->img_buffer_end = psVar10 + iVar5;
            }
            pbVar11 = s->img_buffer;
            goto LAB_00316513;
          }
          bVar3 = 0;
        }
        if ((4 < bVar3) || ((0x1aU >> (bVar3 & 0x1f) & 1) == 0)) {
          stbi__g_failure_reason = "bad component count";
          return 0;
        }
        s->img_n = (uint)bVar3;
        if (bVar3 != 0) {
          lVar14 = 0;
          do {
            *(undefined8 *)((long)&z->img_comp[0].data + lVar14) = 0;
            *(undefined8 *)((long)&z->img_comp[0].linebuf + lVar14) = 0;
            lVar14 = lVar14 + 0x60;
          } while ((ulong)bVar3 * 0x60 != lVar14);
        }
        if (uVar4 == (uint)bVar3 + (uint)bVar3 * 2 + 8) {
          z->rgb = 0;
          uVar18 = (ulong)(uint)s->img_n;
          if (0 < s->img_n) {
            psVar10 = s->buffer_start;
            psVar1 = s->buffer_start + 1;
            piVar17 = &z->img_comp[0].tq;
            lVar14 = 0;
            do {
              pbVar11 = s->img_buffer;
              if (pbVar11 < s->img_buffer_end) {
LAB_00316611:
                s->img_buffer = pbVar11 + 1;
                bVar3 = *pbVar11;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar10,s->buflen);
                  if (iVar5 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar10;
                    s->img_buffer_end = psVar1;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar10;
                    s->img_buffer_end = psVar10 + iVar5;
                  }
                  pbVar11 = s->img_buffer;
                  goto LAB_00316611;
                }
                bVar3 = 0;
              }
              ((anon_struct_96_18_0d0905d3 *)(piVar17 + -3))->id = (uint)bVar3;
              if ((s->img_n == 3) && (bVar3 == "RGB"[lVar14])) {
                z->rgb = z->rgb + 1;
              }
              pbVar11 = s->img_buffer;
              if (pbVar11 < s->img_buffer_end) {
LAB_003166ad:
                s->img_buffer = pbVar11 + 1;
                bVar3 = *pbVar11;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar10,s->buflen);
                  if (iVar5 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar10;
                    s->img_buffer_end = psVar1;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar10;
                    s->img_buffer_end = psVar10 + iVar5;
                  }
                  pbVar11 = s->img_buffer;
                  goto LAB_003166ad;
                }
                bVar3 = 0;
              }
              piVar17[-2] = (uint)(bVar3 >> 4);
              if ((byte)(bVar3 + 0xb0) < 0xc0) {
                stbi__g_failure_reason = "bad H";
                return 0;
              }
              piVar17[-1] = bVar3 & 0xf;
              if ((bVar3 & 0xf) - 5 < 0xfffffffc) {
                stbi__g_failure_reason = "bad V";
                return 0;
              }
              pbVar11 = s->img_buffer;
              if (pbVar11 < s->img_buffer_end) {
LAB_00316754:
                s->img_buffer = pbVar11 + 1;
                bVar3 = *pbVar11;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar10,s->buflen);
                  if (iVar5 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar10;
                    s->img_buffer_end = psVar1;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar10;
                    s->img_buffer_end = psVar10 + iVar5;
                  }
                  pbVar11 = s->img_buffer;
                  goto LAB_00316754;
                }
                bVar3 = 0;
              }
              *piVar17 = (uint)bVar3;
              if (3 < bVar3) {
                stbi__g_failure_reason = "bad TQ";
                return 0;
              }
              lVar14 = lVar14 + 1;
              uVar18 = (ulong)s->img_n;
              piVar17 = piVar17 + 0x18;
            } while (lVar14 < (long)uVar18);
          }
          if (scan != 0) {
            return 1;
          }
          sVar6 = s->img_x;
          b_00 = s->img_y;
          iVar9 = (int)uVar18;
          iVar5 = stbi__mad3sizes_valid(sVar6,b_00,iVar9,0);
          if (iVar5 == 0) {
            stbi__g_failure_reason = "too large";
            return 0;
          }
          uVar4 = 1;
          uVar15 = 1;
          if (0 < iVar9) {
            uVar15 = 1;
            lVar14 = 0;
            uVar4 = 1;
            do {
              uVar7 = *(uint *)((long)&z->img_comp[0].h + lVar14);
              uVar8 = *(uint *)((long)&z->img_comp[0].v + lVar14);
              if ((int)uVar4 < (int)uVar7) {
                uVar4 = uVar7;
              }
              if ((int)uVar15 < (int)uVar8) {
                uVar15 = (ulong)uVar8;
              }
              lVar14 = lVar14 + 0x60;
            } while ((uVar18 & 0xffffffff) * 0x60 != lVar14);
          }
          z->img_h_max = uVar4;
          iVar5 = (int)uVar15;
          z->img_v_max = iVar5;
          z->img_mcu_w = uVar4 * 8;
          z->img_mcu_h = iVar5 * 8;
          uVar7 = ((sVar6 + uVar4 * 8) - 1) / (uVar4 * 8);
          z->img_mcu_x = uVar7;
          uVar8 = ((b_00 + iVar5 * 8) - 1) / (uint)(iVar5 * 8);
          z->img_mcu_y = uVar8;
          if (iVar9 < 1) {
            return 1;
          }
          iVar9 = 1;
          lVar14 = 0;
          while( true ) {
            iVar16 = *(int *)((long)&z->img_comp[0].h + lVar14);
            iVar13 = *(int *)((long)&z->img_comp[0].v + lVar14);
            *(uint *)((long)&z->img_comp[0].x + lVar14) = (iVar16 * sVar6 + (uVar4 - 1)) / uVar4;
            *(int *)((long)&z->img_comp[0].y + lVar14) =
                 (int)((iVar13 * b_00 + iVar5 + -1) / uVar15);
            iVar16 = iVar16 * uVar7;
            a = iVar16 * 8;
            *(int *)((long)&z->img_comp[0].w2 + lVar14) = a;
            iVar13 = iVar13 * uVar8;
            b = iVar13 * 8;
            *(int *)((long)&z->img_comp[0].h2 + lVar14) = b;
            pvVar12 = stbi__malloc_mad2(a,b,0xf);
            puVar2 = (undefined8 *)((long)&z->img_comp[0].raw_coeff + lVar14);
            *puVar2 = 0;
            puVar2[1] = 0;
            *(undefined8 *)((long)&z->img_comp[0].coeff + lVar14) = 0;
            *(void **)((long)&z->img_comp[0].raw_data + lVar14) = pvVar12;
            why = extraout_EDX;
            if (pvVar12 == (void *)0x0) break;
            *(ulong *)((long)&z->img_comp[0].data + lVar14) =
                 (long)pvVar12 + 0xfU & 0xfffffffffffffff0;
            if (z->progressive != 0) {
              *(int *)((long)&z->img_comp[0].coeff_w + lVar14) = iVar16;
              *(int *)((long)&z->img_comp[0].coeff_h + lVar14) = iVar13;
              pvVar12 = stbi__malloc_mad3(a,b,2,0xf);
              *(void **)((long)&z->img_comp[0].raw_coeff + lVar14) = pvVar12;
              why = extraout_EDX_00;
              if (pvVar12 == (void *)0x0) break;
              *(ulong *)((long)&z->img_comp[0].coeff + lVar14) =
                   (long)pvVar12 + 0xfU & 0xfffffffffffffff0;
            }
            iVar9 = iVar9 + 1;
            lVar14 = lVar14 + 0x60;
            if ((uVar18 & 0xffffffff) * 0x60 == lVar14) {
              return 1;
            }
          }
          stbi__g_failure_reason = "outofmem";
          stbi__free_jpeg_components(z,iVar9,why);
          return 0;
        }
        goto LAB_003163d3;
      }
    }
    else if (s->read_from_callbacks != 0) {
      psVar10 = s->buffer_start;
      iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar10,s->buflen);
      if (iVar5 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar10;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar10;
        s->img_buffer_end = psVar10 + iVar5;
      }
      psVar10 = s->img_buffer;
      goto LAB_0031644f;
    }
    stbi__g_failure_reason = "only 8-bit";
  }
  return 0;
}

Assistant:

static int stbi__process_frame_header(stbi__jpeg* z, int scan)
{
    stbi__context* s = z->s;
    int Lf, p, i, q, h_max = 1, v_max = 1, c;
    Lf = stbi__get16be(s);
    if (Lf < 11)
        return stbi__err("bad SOF len", "Corrupt JPEG"); // JPEG
    p = stbi__get8(s);
    if (p != 8)
        return stbi__err("only 8-bit", "JPEG format not supported: 8-bit only"); // JPEG baseline
    s->img_y = stbi__get16be(s);
    if (s->img_y == 0)
        return stbi__err("no header height", "JPEG format not supported: delayed height"); // Legal, but we don't handle it--but neither does IJG
    s->img_x = stbi__get16be(s);
    if (s->img_x == 0)
        return stbi__err("0 width", "Corrupt JPEG"); // JPEG requires
    c = stbi__get8(s);
    if (c != 3 && c != 1 && c != 4)
        return stbi__err("bad component count", "Corrupt JPEG");
    s->img_n = c;
    for (i = 0; i < c; ++i) {
        z->img_comp[i].data = NULL;
        z->img_comp[i].linebuf = NULL;
    }

    if (Lf != 8 + 3 * s->img_n)
        return stbi__err("bad SOF len", "Corrupt JPEG");

    z->rgb = 0;
    for (i = 0; i < s->img_n; ++i) {
        static const unsigned char rgb[3] = { 'R', 'G', 'B' };
        z->img_comp[i].id = stbi__get8(s);
        if (s->img_n == 3 && z->img_comp[i].id == rgb[i])
            ++z->rgb;
        q = stbi__get8(s);
        z->img_comp[i].h = (q >> 4);
        if (!z->img_comp[i].h || z->img_comp[i].h > 4)
            return stbi__err("bad H", "Corrupt JPEG");
        z->img_comp[i].v = q & 15;
        if (!z->img_comp[i].v || z->img_comp[i].v > 4)
            return stbi__err("bad V", "Corrupt JPEG");
        z->img_comp[i].tq = stbi__get8(s);
        if (z->img_comp[i].tq > 3)
            return stbi__err("bad TQ", "Corrupt JPEG");
    }

    if (scan != STBI__SCAN_load)
        return 1;

    if (!stbi__mad3sizes_valid(s->img_x, s->img_y, s->img_n, 0))
        return stbi__err("too large", "Image too large to decode");

    for (i = 0; i < s->img_n; ++i) {
        if (z->img_comp[i].h > h_max)
            h_max = z->img_comp[i].h;
        if (z->img_comp[i].v > v_max)
            v_max = z->img_comp[i].v;
    }

    // compute interleaved mcu info
    z->img_h_max = h_max;
    z->img_v_max = v_max;
    z->img_mcu_w = h_max * 8;
    z->img_mcu_h = v_max * 8;
    // these sizes can't be more than 17 bits
    z->img_mcu_x = (s->img_x + z->img_mcu_w - 1) / z->img_mcu_w;
    z->img_mcu_y = (s->img_y + z->img_mcu_h - 1) / z->img_mcu_h;

    for (i = 0; i < s->img_n; ++i) {
        // number of effective pixels (e.g. for non-interleaved MCU)
        z->img_comp[i].x = (s->img_x * z->img_comp[i].h + h_max - 1) / h_max;
        z->img_comp[i].y = (s->img_y * z->img_comp[i].v + v_max - 1) / v_max;
        // to simplify generation, we'll allocate enough memory to decode
        // the bogus oversized data from using interleaved MCUs and their
        // big blocks (e.g. a 16x16 iMCU on an image of width 33); we won't
        // discard the extra data until colorspace conversion
        //
        // img_mcu_x, img_mcu_y: <=17 bits; comp[i].h and .v are <=4 (checked earlier)
        // so these muls can't overflow with 32-bit ints (which we require)
        z->img_comp[i].w2 = z->img_mcu_x * z->img_comp[i].h * 8;
        z->img_comp[i].h2 = z->img_mcu_y * z->img_comp[i].v * 8;
        z->img_comp[i].coeff = 0;
        z->img_comp[i].raw_coeff = 0;
        z->img_comp[i].linebuf = NULL;
        z->img_comp[i].raw_data = stbi__malloc_mad2(z->img_comp[i].w2, z->img_comp[i].h2, 15);
        if (z->img_comp[i].raw_data == NULL)
            return stbi__free_jpeg_components(z, i + 1, stbi__err("outofmem", "Out of memory"));
        // align blocks for idct using mmx/sse
        z->img_comp[i].data = (stbi_uc*)(((size_t)z->img_comp[i].raw_data + 15) & ~15);
        if (z->progressive) {
            // w2, h2 are multiples of 8 (see above)
            z->img_comp[i].coeff_w = z->img_comp[i].w2 / 8;
            z->img_comp[i].coeff_h = z->img_comp[i].h2 / 8;
            z->img_comp[i].raw_coeff = stbi__malloc_mad3(z->img_comp[i].w2, z->img_comp[i].h2, sizeof(short), 15);
            if (z->img_comp[i].raw_coeff == NULL)
                return stbi__free_jpeg_components(z, i + 1, stbi__err("outofmem", "Out of memory"));
            z->img_comp[i].coeff = (short*)(((size_t)z->img_comp[i].raw_coeff + 15) & ~15);
        }
    }

    return 1;
}